

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prototype_factory.h
# Opt level: O2

product_type __thiscall
mwheel::
PrototypeFactory<(anonymous_namespace)::Base,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::Base>_>
::create<>(PrototypeFactory<(anonymous_namespace)::Base,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::Base>_>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tag)

{
  bool bVar1;
  iterator iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  _Base_ptr in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  product_type pVar4;
  
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::Base>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::Base>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::Base>_>_>_>
          ::_M_lower_bound((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::Base>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::Base>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::Base>_>_>_>
                            *)tag[1].field_2._M_allocated_capacity,
                           (_Link_type)&tag[1]._M_string_length,in_RDX,in_RCX);
  if (iVar2._M_node != (_Base_ptr)&tag[1]._M_string_length) {
    bVar1 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_RDX,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(iVar2._M_node + 1));
    if (!bVar1) {
      (**(code **)**(undefined8 **)(iVar2._M_node + 2))(this);
      _Var3._M_pi = extraout_RDX_00;
      goto LAB_00113d81;
    }
  }
  if ((tag->field_2)._M_allocated_capacity == 0) {
    std::__throw_bad_function_call();
  }
  (**(code **)((long)&tag->field_2 + 8))(this,tag);
  _Var3._M_pi = extraout_RDX;
LAB_00113d81:
  pVar4.super___shared_ptr<(anonymous_namespace)::Base,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var3._M_pi;
  pVar4.super___shared_ptr<(anonymous_namespace)::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (product_type)
         pVar4.super___shared_ptr<(anonymous_namespace)::Base,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

product_type create(const TagType &tag, ParameterTypes... parameters) {
    auto iterator = m_prototype_map.find(tag);
    if (iterator == m_prototype_map.end()) {
      return m_on_tag_not_registered(tag);
    }
    return iterator->second->clone(parameters...);
  }